

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseExpectedValues(WastParser *this,ExpectationPtr *expectation)

{
  Expectation *pEVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  Result RVar4;
  undefined1 local_48 [8];
  Location loc;
  
  GetLocation(&loc,this);
  bVar3 = PeekMatchLpar(this,Either);
  if (bVar3) {
    std::make_unique<wabt::EitherExpectation,wabt::Location&>((Location *)local_48);
    RVar4 = ParseEither(this,(ConstVector *)((long)local_48 + 0x28));
    auVar2 = local_48;
    if (RVar4.enum_ != Error) {
      local_48 = (undefined1  [8])0x0;
      pEVar1 = (expectation->_M_t).
               super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
               super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl;
      (expectation->_M_t).
      super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
      super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl = (Expectation *)auVar2;
      if (pEVar1 == (Expectation *)0x0) {
        return (Result)Ok;
      }
      (*pEVar1->_vptr_Expectation[1])();
    }
    if (local_48 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_48)[1])();
    }
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
  }
  else {
    std::make_unique<wabt::ValueExpectation,wabt::Location&>((Location *)local_48);
    RVar4 = ParseConstList(this,(ConstVector *)((long)local_48 + 0x28),Expectation);
    auVar2 = local_48;
    if (RVar4.enum_ != Error) {
      local_48 = (undefined1  [8])0x0;
      pEVar1 = (expectation->_M_t).
               super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
               super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl;
      (expectation->_M_t).
      super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
      super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl = (Expectation *)auVar2;
      if (pEVar1 == (Expectation *)0x0) {
        return (Result)Ok;
      }
      (*pEVar1->_vptr_Expectation[1])();
    }
    if (local_48 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_48)[1])();
    }
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseExpectedValues(ExpectationPtr* expectation) {
  WABT_TRACE(ParseExpectedValues);
  Location loc = GetLocation();
  if (PeekMatchLpar(TokenType::Either)) {
    auto either = std::make_unique<EitherExpectation>(loc);
    CHECK_RESULT(ParseEither(&either->expected));
    *expectation = std::move(either);
  } else {
    auto values = std::make_unique<ValueExpectation>(loc);
    CHECK_RESULT(ParseConstList(&values->expected, ConstType::Expectation));
    *expectation = std::move(values);
  }
  return Result::Ok;
}